

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O3

Var Js::JavascriptSymbol::TryInvokeRemotelyOrThrow
              (JavascriptMethod entryPoint,ScriptContext *scriptContext,Arguments *args,
              int32 errorCode,PCWSTR varName)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  Var pvVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  Type local_58;
  Type local_50;
  RecyclableObject *local_48;
  Var result;
  int32 local_34;
  
  result = varName;
  local_34 = errorCode;
  pvVar6 = Arguments::operator[](args,0);
  if (pvVar6 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00d231c2;
    *puVar7 = 0;
LAB_00d23080:
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d231c2;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar8->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        pvVar6 = Arguments::operator[](args,0);
        pRVar8 = VarTo<Js::RecyclableObject>(pvVar6);
        local_58 = args->Info;
        local_50 = args->Values;
        iVar4 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])(pRVar8,entryPoint,&local_58,&local_48);
        if (iVar4 != 0) {
          return local_48;
        }
      }
      goto LAB_00d23198;
    }
    BVar5 = RecyclableObject::IsExternal(pRVar8);
    if (BVar5 != 0) goto LAB_00d23198;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  else {
    if (((ulong)pvVar6 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)pvVar6 >> 0x32 != 0 || ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000)
      goto LAB_00d23198;
      goto LAB_00d23080;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar3) {
LAB_00d231c2:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar7 = 0;
LAB_00d23198:
  bVar3 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
  if (!bVar3) {
    return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  JavascriptError::ThrowTypeError(scriptContext,local_34,(PCWSTR)result);
}

Assistant:

Var JavascriptSymbol::TryInvokeRemotelyOrThrow(JavascriptMethod entryPoint, ScriptContext * scriptContext, Arguments & args, int32 errorCode, PCWSTR varName)
    {
        if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
        {
            Var result;
            if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(entryPoint, args, &result))
            {
                return result;
            }
        }
        // Don't error if we disabled implicit calls
        if (scriptContext->GetThreadContext()->RecordImplicitException())
        {
            JavascriptError::ThrowTypeError(scriptContext, errorCode, varName);
        }
        else
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
    }